

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds2.cpp
# Opt level: O0

bool ReadDS2(MemFile *file,shared_ptr<Disk> *disk)

{
  byte extraout_AL;
  bool bVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  undefined1 *puVar6;
  exception *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  const_iterator __first;
  const_iterator __last;
  element_type *peVar8;
  FILE *__stream;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_168;
  const_iterator local_160;
  allocator<unsigned_char> local_151;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_150;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  undefined1 local_140 [8];
  Data data;
  size_t offset;
  string local_118;
  undefined4 local_f8;
  undefined1 local_e4 [8];
  Format fmt;
  MemFile file2;
  string path;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  psVar4 = MemFile::path_abi_cxx11_(file);
  std::__cxx11::string::string((string *)&file2.m_compress,(string *)psVar4);
  MemFile::MemFile((MemFile *)&fmt.gap3);
  __stream = (FILE *)0x0;
  Format::Format((Format *)local_e4,MGT);
  MemFile::rewind(file,__stream);
  if ((extraout_AL & 1) != 0) {
    iVar2 = MemFile::size(file);
    iVar3 = Format::disk_size((Format *)local_e4);
    if (iVar2 == iVar3 / 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"dsk",(allocator<char> *)((long)&offset + 7));
      bVar1 = IsFileExt((string *)&file2.m_compress,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&offset + 7));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        lVar5 = std::__cxx11::string::length();
        data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(lVar5 + -1);
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
        *puVar6 = 0x32;
        MemFile::open((MemFile *)&fmt.gap3,(char *)&file2.m_compress,1);
        iVar2 = MemFile::size((MemFile *)&fmt.gap3);
        iVar3 = Format::disk_size((Format *)local_e4);
        if (iVar2 != iVar3 / 2) {
          this = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<std::__cxx11::string&,char_const(&)[24]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &file2.m_compress,(char (*) [24])" file size is incorrect");
          __cxa_throw(this,&util::exception::typeinfo,util::exception::~exception);
        }
        pvVar7 = &MemFile::data(file)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_148._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar7);
        pvVar7 = &MemFile::data(file)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_150._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar7);
        std::allocator<unsigned_char>::allocator(&local_151);
        Data::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((Data *)local_140,local_148,local_150,&local_151);
        std::allocator<unsigned_char>::~allocator(&local_151);
        local_168._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140)
        ;
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_160,&local_168);
        pvVar7 = &MemFile::data((MemFile *)&fmt.gap3)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar7);
        pvVar7 = &MemFile::data((MemFile *)&fmt.gap3)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar7);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_140,local_160,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )__first._M_current,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )__last._M_current);
        peVar8 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            disk);
        Disk::format(peVar8,(Format *)local_e4,(Data *)local_140,true);
        peVar8 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            disk);
        std::__cxx11::string::operator=((string *)&peVar8->strType,"DS2");
        file_local._7_1_ = true;
        local_f8 = 1;
        Data::~Data((Data *)local_140);
      }
      else {
        file_local._7_1_ = false;
        local_f8 = 1;
      }
      goto LAB_0026a871;
    }
  }
  file_local._7_1_ = false;
  local_f8 = 1;
LAB_0026a871:
  MemFile::~MemFile((MemFile *)&fmt.gap3);
  std::__cxx11::string::~string((string *)&file2.m_compress);
  return file_local._7_1_;
}

Assistant:

bool ReadDS2(MemFile& file, std::shared_ptr<Disk>& disk)
{
    std::string path = file.path();
    MemFile file2;

    Format fmt{ RegularFormat::MGT };

    // The input should be half a standard SAM disk in size
    if (!file.rewind() || file.size() != fmt.disk_size() / 2)
        return false;

    // Require the supplied file be head 0
    if (!IsFileExt(path, "dsk"))
        return false;

    // DSK->DS2
    size_t offset = path.length() - 1;
    path[offset] = '2';

    // The DS2 file must also be present
    try {
        file2.open(path);
    }
    catch (...) {
        return false;
    }

    // The companion file should also contain a single side
    if (file2.size() != fmt.disk_size() / 2)
        throw util::exception(path, " file size is incorrect");

    // Join the sides
    Data data(file.data().begin(), file.data().end());
    data.insert(data.end(), file2.data().begin(), file2.data().end());

    disk->format(fmt, data, true);
    disk->strType = "DS2";

    return true;
}